

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall QPDFJob::doJSONObjectinfo(QPDFJob *this,Pipeline *p,bool *first,QPDF *pdf)

{
  bool *p_00;
  bool bVar1;
  element_type *peVar2;
  reference this_00;
  size_type sVar3;
  string local_2c8;
  byte local_2a4;
  byte local_2a3;
  byte local_2a2;
  allocator<char> local_2a1;
  string local_2a0 [39];
  byte local_279;
  string local_278;
  JSON local_258;
  allocator<char> local_241;
  JSON local_240 [2];
  JSON local_220;
  byte local_20c;
  byte local_20b;
  byte local_20a;
  allocator<char> local_209;
  string local_208 [39];
  byte local_1e1;
  string local_1e0;
  JSON local_1c0;
  allocator<char> local_1a9;
  JSON local_1a8 [2];
  JSON local_188;
  JSON local_178;
  allocator<char> local_161;
  JSON local_160 [2];
  JSON local_140;
  byte local_129;
  undefined1 local_128 [7];
  bool is_stream;
  allocator<char> local_111;
  JSON local_110 [2];
  undefined1 local_f0 [8];
  JSON j_stream;
  JSON j_details;
  QPDFObjectHandle *obj;
  iterator __end1;
  iterator __begin1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range1;
  set wanted_og;
  bool all_objects;
  bool first_object;
  allocator<char> local_49;
  string local_48;
  QPDF *local_28;
  QPDF *pdf_local;
  bool *first_local;
  Pipeline *p_local;
  QPDFJob *this_local;
  
  local_28 = pdf;
  pdf_local = (QPDF *)first;
  first_local = (bool *)p;
  p_local = (Pipeline *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"objectinfo",&local_49);
  JSON::writeDictionaryKey(p,first,&local_48,1);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  wanted_og.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
  super__Rb_tree_header._M_node_count._3_1_ = 1;
  JSON::writeDictionaryOpen
            ((Pipeline *)first_local,
             (bool *)((long)&wanted_og.
                             super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                             ._M_t._M_impl.super__Rb_tree_header._M_node_count + 3),1);
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  wanted_og.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
  super__Rb_tree_header._M_node_count._2_1_ =
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::empty(&peVar2->json_objects);
  getWantedJSONObjects((set *)&__range1,this);
  QPDF::getAllObjects((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin1,
                      local_28);
  __end1 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin
                     ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin1);
  obj = (QPDFObjectHandle *)
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end
                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                     *)&obj), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
              ::operator*(&__end1);
    bVar1 = true;
    if ((wanted_og.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
         _M_impl.super__Rb_tree_header._M_node_count._2_1_ & 1) == 0) {
      j_details.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)QPDFObjectHandle::getObjGen(this_00);
      sVar3 = std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::count
                        ((set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)
                         &__range1,
                         (key_type *)
                         &j_details.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      bVar1 = sVar3 != 0;
    }
    if (bVar1) {
      JSON::makeDictionary();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_110,"stream",&local_111);
      JSON::makeDictionary();
      JSON::addDictionaryMember
                ((JSON *)local_f0,
                 (string *)
                 &j_stream.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,local_110);
      JSON::~JSON((JSON *)local_128);
      std::__cxx11::string::~string((string *)local_110);
      std::allocator<char>::~allocator(&local_111);
      local_129 = QPDFObjectHandle::isStream(this_00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_160,"is",&local_161);
      JSON::makeBool(&local_178,(bool)(local_129 & 1));
      JSON::addDictionaryMember(&local_140,(string *)local_f0,local_160);
      JSON::~JSON(&local_140);
      JSON::~JSON(&local_178);
      std::__cxx11::string::~string((string *)local_160);
      std::allocator<char>::~allocator(&local_161);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_1a8,"length",&local_1a9);
      local_1e1 = 0;
      local_20a = 0;
      local_20b = 0;
      local_20c = 0;
      if ((local_129 & 1) == 0) {
        JSON::makeNull();
      }
      else {
        QPDFObjectHandle::getDict((QPDFObjectHandle *)&local_1e0);
        local_1e1 = 1;
        std::allocator<char>::allocator();
        local_20a = 1;
        std::__cxx11::string::string<std::allocator<char>>(local_208,"/Length",&local_209);
        local_20b = 1;
        QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_1e0.field_2,&local_1e0);
        local_20c = 1;
        peVar2 = std::
                 __shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        QPDFObjectHandle::getJSON
                  ((QPDFObjectHandle *)&local_1c0,(int)&local_1e0 + 0x10,
                   SUB41(peVar2->json_version,0));
      }
      JSON::addDictionaryMember(&local_188,(string *)local_f0,local_1a8);
      JSON::~JSON(&local_188);
      JSON::~JSON(&local_1c0);
      if ((local_20c & 1) != 0) {
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_1e0.field_2);
      }
      if ((local_20b & 1) != 0) {
        std::__cxx11::string::~string(local_208);
      }
      if ((local_20a & 1) != 0) {
        std::allocator<char>::~allocator(&local_209);
      }
      if ((local_1e1 & 1) != 0) {
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_1e0);
      }
      std::__cxx11::string::~string((string *)local_1a8);
      std::allocator<char>::~allocator(&local_1a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_240,"filter",&local_241);
      local_279 = 0;
      local_2a2 = 0;
      local_2a3 = 0;
      local_2a4 = 0;
      if ((local_129 & 1) == 0) {
        JSON::makeNull();
      }
      else {
        QPDFObjectHandle::getDict((QPDFObjectHandle *)&local_278);
        local_279 = 1;
        std::allocator<char>::allocator();
        local_2a2 = 1;
        std::__cxx11::string::string<std::allocator<char>>(local_2a0,"/Filter",&local_2a1);
        local_2a3 = 1;
        QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_278.field_2,&local_278);
        local_2a4 = 1;
        peVar2 = std::
                 __shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        QPDFObjectHandle::getJSON
                  ((QPDFObjectHandle *)&local_258,(int)&local_278 + 0x10,
                   SUB41(peVar2->json_version,0));
      }
      JSON::addDictionaryMember(&local_220,(string *)local_f0,local_240);
      JSON::~JSON(&local_220);
      JSON::~JSON(&local_258);
      if ((local_2a4 & 1) != 0) {
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_278.field_2);
      }
      if ((local_2a3 & 1) != 0) {
        std::__cxx11::string::~string(local_2a0);
      }
      if ((local_2a2 & 1) != 0) {
        std::allocator<char>::~allocator(&local_2a1);
      }
      if ((local_279 & 1) != 0) {
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_278);
      }
      std::__cxx11::string::~string((string *)local_240);
      std::allocator<char>::~allocator(&local_241);
      p_00 = first_local;
      QPDFObjectHandle::unparse_abi_cxx11_(&local_2c8,this_00);
      JSON::writeDictionaryItem
                ((Pipeline *)p_00,
                 (bool *)((long)&wanted_og.
                                 super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                                 ._M_t._M_impl.super__Rb_tree_header._M_node_count + 3),&local_2c8,
                 (JSON *)&j_stream.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,2);
      std::__cxx11::string::~string((string *)&local_2c8);
      JSON::~JSON((JSON *)local_f0);
      JSON::~JSON((JSON *)&j_stream.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
    }
    __gnu_cxx::
    __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
    ::operator++(&__end1);
  }
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin1);
  JSON::writeDictionaryClose
            ((Pipeline *)first_local,
             (bool)(wanted_og.
                    super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
                    _M_impl.super__Rb_tree_header._M_node_count._3_1_ & 1),1);
  QPDFObjGen::set::~set((set *)&__range1);
  return;
}

Assistant:

void
QPDFJob::doJSONObjectinfo(Pipeline* p, bool& first, QPDF& pdf)
{
    JSON::writeDictionaryKey(p, first, "objectinfo", 1);
    bool first_object = true;
    JSON::writeDictionaryOpen(p, first_object, 1);
    bool all_objects = m->json_objects.empty();
    auto wanted_og = getWantedJSONObjects();
    for (auto& obj: pdf.getAllObjects()) {
        if (all_objects || wanted_og.count(obj.getObjGen())) {
            auto j_details = JSON::makeDictionary();
            auto j_stream = j_details.addDictionaryMember("stream", JSON::makeDictionary());
            bool is_stream = obj.isStream();
            j_stream.addDictionaryMember("is", JSON::makeBool(is_stream));
            j_stream.addDictionaryMember(
                "length",
                (is_stream ? obj.getDict().getKey("/Length").getJSON(m->json_version, true)
                           : JSON::makeNull()));
            j_stream.addDictionaryMember(
                "filter",
                (is_stream ? obj.getDict().getKey("/Filter").getJSON(m->json_version, true)
                           : JSON::makeNull()));
            JSON::writeDictionaryItem(p, first_object, obj.unparse(), j_details, 2);
        }
    }
    JSON::writeDictionaryClose(p, first_object, 1);
}